

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.H
# Opt level: O3

Box * __thiscall
amrex::BATbndryReg::operator()(Box *__return_storage_ptr__,BATbndryReg *this,Box *a_bx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong local_40;
  uint local_38;
  ulong local_30;
  uint local_28;
  
  uVar6 = *(ulong *)(a_bx->smallend).vect;
  uVar10 = uVar6 >> 0x20;
  uVar8 = (a_bx->smallend).vect[2];
  iVar3 = (this->m_crse_ratio).vect[0];
  uVar11 = (uint)uVar6;
  if (iVar3 != 1) {
    if (iVar3 == 4) {
      if ((int)uVar11 < 0) {
        uVar11 = (int)uVar11 >> 2;
      }
      else {
        uVar11 = uVar11 >> 2;
      }
    }
    else if (iVar3 == 2) {
      if ((int)uVar11 < 0) {
        uVar11 = (int)uVar11 >> 1;
      }
      else {
        uVar11 = uVar11 >> 1;
      }
    }
    else if ((int)uVar11 < 0) {
      uVar11 = ~((int)~uVar11 / iVar3);
    }
    else {
      uVar11 = (uint)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                     (long)iVar3);
    }
  }
  iVar4 = (this->m_crse_ratio).vect[1];
  if (iVar4 != 1) {
    uVar9 = (uint)(uVar6 >> 0x20);
    if (iVar4 == 4) {
      if ((long)uVar6 < 0) {
        uVar10 = (ulong)(uint)((int)uVar9 >> 2);
      }
      else {
        uVar10 = (ulong)(uVar9 >> 2);
      }
    }
    else if (iVar4 == 2) {
      if ((long)uVar6 < 0) {
        uVar10 = (ulong)(uint)((int)uVar9 >> 1);
      }
      else {
        uVar10 = (ulong)(uVar9 >> 1);
      }
    }
    else if ((long)uVar6 < 0) {
      uVar10 = (ulong)(uint)~((int)~uVar9 / iVar4);
    }
    else {
      uVar10 = (long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar10) / (long)iVar4 & 0xffffffff
      ;
    }
  }
  iVar5 = (this->m_crse_ratio).vect[2];
  if (iVar5 != 1) {
    if (iVar5 == 4) {
      if ((int)uVar8 < 0) {
        uVar8 = (int)uVar8 >> 2;
      }
      else {
        uVar8 = uVar8 >> 2;
      }
    }
    else if (iVar5 == 2) {
      if ((int)uVar8 < 0) {
        uVar8 = (int)uVar8 >> 1;
      }
      else {
        uVar8 = uVar8 >> 1;
      }
    }
    else if ((int)uVar8 < 0) {
      uVar8 = ~((int)~uVar8 / iVar5);
    }
    else {
      uVar8 = (int)uVar8 / iVar5;
    }
  }
  local_30 = (ulong)uVar11 | uVar10 << 0x20;
  local_28 = uVar8;
  uVar6 = *(ulong *)(a_bx->bigend).vect;
  uVar12 = uVar6 >> 0x20;
  local_38 = (a_bx->bigend).vect[2];
  uVar9 = (uint)uVar6;
  if (iVar3 != 1) {
    if (iVar3 == 4) {
      if ((int)uVar9 < 0) {
        uVar9 = (int)uVar9 >> 2;
      }
      else {
        uVar9 = uVar9 >> 2;
      }
    }
    else if (iVar3 == 2) {
      if ((int)uVar9 < 0) {
        uVar9 = (int)uVar9 >> 1;
      }
      else {
        uVar9 = uVar9 >> 1;
      }
    }
    else if ((int)uVar9 < 0) {
      uVar9 = ~((int)~uVar9 / iVar3);
    }
    else {
      uVar9 = (uint)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                    (long)iVar3);
    }
  }
  if (iVar4 != 1) {
    uVar7 = (uint)(uVar6 >> 0x20);
    if (iVar4 == 4) {
      if ((long)uVar6 < 0) {
        uVar12 = (ulong)(uint)((int)uVar7 >> 2);
      }
      else {
        uVar12 = (ulong)(uVar7 >> 2);
      }
    }
    else if (iVar4 == 2) {
      if ((long)uVar6 < 0) {
        uVar12 = (ulong)(uint)((int)uVar7 >> 1);
      }
      else {
        uVar12 = (ulong)(uVar7 >> 1);
      }
    }
    else if ((long)uVar6 < 0) {
      uVar12 = (ulong)(uint)~((int)~uVar7 / iVar4);
    }
    else {
      uVar12 = (long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar12) / (long)iVar4 & 0xffffffff
      ;
    }
  }
  if (iVar5 != 1) {
    if (iVar5 == 4) {
      if ((int)local_38 < 0) {
        local_38 = (int)local_38 >> 2;
      }
      else {
        local_38 = local_38 >> 2;
      }
    }
    else if (iVar5 == 2) {
      if ((int)local_38 < 0) {
        local_38 = (int)local_38 >> 1;
      }
      else {
        local_38 = local_38 >> 1;
      }
    }
    else if ((int)local_38 < 0) {
      local_38 = ~((int)~local_38 / iVar5);
    }
    else {
      local_38 = (int)local_38 / iVar5;
    }
  }
  local_40 = (ulong)uVar9 | uVar12 << 0x20;
  iVar3 = (this->m_face).val;
  uVar7 = iVar3 % 3;
  if (iVar3 < 3) {
    *(undefined4 *)((long)&local_40 + (long)(int)uVar7 * 4) =
         *(undefined4 *)((long)&local_30 + (long)(int)uVar7 * 4);
    local_30 = CONCAT44((int)uVar10,uVar11);
  }
  else {
    *(undefined4 *)((long)&local_30 + (ulong)uVar7 * 4) =
         *(undefined4 *)((long)&local_40 + (ulong)uVar7 * 4);
    local_40 = CONCAT44((int)uVar12,uVar9);
  }
  uVar1 = *(undefined8 *)(this->m_loshft).vect;
  uVar2 = *(undefined8 *)(this->m_hishft).vect;
  iVar3 = (this->m_hishft).vect[2];
  uVar8 = (this->m_typ).itype;
  (__return_storage_ptr__->smallend).vect[2] = local_28 + (this->m_loshft).vect[2];
  *(ulong *)(__return_storage_ptr__->smallend).vect =
       CONCAT44((int)((ulong)uVar1 >> 0x20) + (int)(local_30 >> 0x20),(int)uVar1 + (int)local_30);
  *(ulong *)(__return_storage_ptr__->bigend).vect =
       CONCAT44((int)((ulong)uVar2 >> 0x20) + (int)(local_40 >> 0x20),(int)uVar2 + (int)local_40);
  (__return_storage_ptr__->bigend).vect[2] = local_38 + iVar3;
  (__return_storage_ptr__->btype).itype = uVar8;
  return __return_storage_ptr__;
}

Assistant:

Box operator() (const Box& a_bx) const noexcept {
        IntVect lo = amrex::coarsen(a_bx.smallEnd(), m_crse_ratio);
        IntVect hi = amrex::coarsen(a_bx.bigEnd(), m_crse_ratio);
        const int d = m_face.coordDir();
        if (m_face.isLow()) {
            hi[d] = lo[d];
        } else {
            lo[d] = hi[d];
        }
        lo += m_loshft;
        hi += m_hishft;
        return Box(lo,hi,m_typ);
    }